

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeAddrMode5Operand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  MCInst *mcInst;
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t uVar2;
  uint32_t uVar3;
  DecodeStatus In;
  uint uVar4;
  uint imm;
  uint U;
  uint Rn;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Val_local;
  MCInst *Inst_local;
  
  U = 3;
  _Rn = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Val;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Val,9,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,8,1);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0,8);
  In = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rn);
  _Var1 = Check(&U,In);
  mcInst = pMStack_18;
  if (_Var1) {
    if (uVar2 == 0) {
      uVar4 = ARM_AM_getAM5Opc(ARM_AM_sub,(uchar)uVar3);
      MCOperand_CreateImm0(mcInst,(ulong)uVar4);
    }
    else {
      uVar4 = ARM_AM_getAM5Opc(ARM_AM_add,(uchar)uVar3);
      MCOperand_CreateImm0(mcInst,(ulong)uVar4);
    }
    Inst_local._4_4_ = U;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeAddrMode5Operand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 9, 4);
	unsigned U = fieldFromInstruction_4(Val, 8, 1);
	unsigned imm = fieldFromInstruction_4(Val, 0, 8);

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	if (U)
		MCOperand_CreateImm0(Inst, ARM_AM_getAM5Opc(ARM_AM_add, (unsigned char)imm));
	else
		MCOperand_CreateImm0(Inst, ARM_AM_getAM5Opc(ARM_AM_sub, (unsigned char)imm));

	return S;
}